

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void __thiscall unittest::UnitTest::TestParseGenerate1W(UnitTest *this)

{
  wchar_t *msg;
  bool result;
  wstring local_1b8 [48];
  wostringstream local_188 [8];
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> os;
  UnitTest *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_188);
  result = runtest<wchar_t>("test1.ini","test1.output",
                            (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_188);
  Assert::IsTrue(result);
  std::__cxx11::wostringstream::str();
  msg = (wchar_t *)std::__cxx11::wstring::c_str();
  Logger::WriteMessage(msg);
  std::__cxx11::wstring::~wstring(local_1b8);
  std::__cxx11::wostringstream::~wostringstream(local_188);
  return;
}

Assistant:

TEST_METHOD(TestParseGenerate1W)
		{
			std::basic_ostringstream<wchar_t> os;
			Assert::IsTrue(runtest<wchar_t>("test1.ini", "test1.output", os));
			Logger::WriteMessage(os.str().c_str());
		}